

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resSim.c
# Opt level: O2

void Res_SimCountResults(Res_Sim_t *p,int *pnDcs,int *pnOnes,int *pnZeros,int fVerbose)

{
  Vec_Ptr_t *pVVar1;
  Abc_Obj_t *pAVar2;
  void *pvVar3;
  void *pvVar4;
  int *piVar5;
  long lVar6;
  double dVar7;
  
  pVVar1 = p->vPats;
  pAVar2 = Abc_NtkPo(p->pAig,0);
  pvVar3 = Vec_PtrEntry(pVVar1,pAVar2->Id);
  pVVar1 = p->vPats;
  pAVar2 = Abc_NtkPo(p->pAig,1);
  pvVar4 = Vec_PtrEntry(pVVar1,pAVar2->Id);
  for (lVar6 = 0; lVar6 < p->nBytesIn; lVar6 = lVar6 + 1) {
    piVar5 = pnDcs;
    if ((*(char *)((long)pvVar3 + lVar6) != '\0') &&
       (piVar5 = pnZeros, *(char *)((long)pvVar4 + lVar6) != '\0')) {
      piVar5 = pnOnes;
    }
    *piVar5 = *piVar5 + 1;
  }
  if (fVerbose != 0) {
    dVar7 = (double)(*pnZeros + *pnDcs + *pnOnes);
    printf("Dc = %7.2f %%  ",((double)*pnDcs * 100.0) / dVar7);
    printf("On = %7.2f %%  ",((double)*pnOnes * 100.0) / dVar7);
    printf("Off = %7.2f %%  ",((double)*pnZeros * 100.0) / dVar7);
    return;
  }
  return;
}

Assistant:

void Res_SimCountResults( Res_Sim_t * p, int * pnDcs, int * pnOnes, int * pnZeros, int fVerbose )
{
    unsigned char * pInfoCare, * pInfoNode;
    int i, nTotal = 0;
    pInfoCare = (unsigned char *)Vec_PtrEntry( p->vPats, Abc_NtkPo(p->pAig, 0)->Id );
    pInfoNode = (unsigned char *)Vec_PtrEntry( p->vPats, Abc_NtkPo(p->pAig, 1)->Id );
    for ( i = 0; i < p->nBytesIn; i++ )
    {
        if ( !pInfoCare[i] )
            (*pnDcs)++;
        else if ( !pInfoNode[i] )
            (*pnZeros)++;
        else
            (*pnOnes)++;
    }
    nTotal += *pnDcs;
    nTotal += *pnZeros;
    nTotal += *pnOnes;
    if ( fVerbose )
    {
        printf( "Dc = %7.2f %%  ",  100.0*(*pnDcs)  /nTotal );
        printf( "On = %7.2f %%  ",  100.0*(*pnOnes) /nTotal );
        printf( "Off = %7.2f %%  ", 100.0*(*pnZeros)/nTotal );
    }
}